

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply_from(tnt_reply *r,tnt_reply_t rcv,void *ptr)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t local_50;
  size_t hdr_length;
  size_t size;
  char *data;
  undefined1 auStack_2c [3];
  char length [5];
  int alloc;
  void *ptr_local;
  tnt_reply_t rcv_local;
  tnt_reply *r_local;
  
  _auStack_2c = r->alloc;
  unique0x100001af = ptr;
  memset(r,0,0x78);
  r->alloc = _auStack_2c;
  size = (long)&data + 7;
  sVar2 = (*rcv)(stack0xffffffffffffffd8,(char *)((long)&data + 7),5);
  if ((sVar2 != -1) && (mp_type_hint[data._7_1_] == MP_UINT)) {
    hdr_length = mp_decode_uint((char **)&size);
    pcVar3 = (char *)tnt_mem_alloc(hdr_length);
    r->buf = pcVar3;
    r->buf_size = hdr_length;
    if ((r->buf != (char *)0x0) &&
       ((sVar2 = (*rcv)(stack0xffffffffffffffd8,r->buf,hdr_length), sVar2 != -1 &&
        (iVar1 = tnt_reply_hdr0(r,r->buf,r->buf_size,&local_50), iVar1 == 0)))) {
      if (hdr_length == local_50) {
        return 0;
      }
      iVar1 = tnt_reply_body0(r,r->buf + local_50,r->buf_size - local_50,(size_t *)0x0);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  if (r->buf != (char *)0x0) {
    tnt_mem_free(r->buf);
  }
  _auStack_2c = r->alloc;
  memset(r,0,0x78);
  r->alloc = _auStack_2c;
  return -1;
}

Assistant:

int tnt_reply_from(struct tnt_reply *r, tnt_reply_t rcv, void *ptr) {
	/* cleanup, before processing response */
	int alloc = r->alloc;
	memset(r, 0 , sizeof(struct tnt_reply));
	r->alloc = alloc;
	/* reading iproto header */
	char length[TNT_REPLY_IPROTO_HDR_SIZE]; const char *data = (const char *)length;
	if (rcv(ptr, length, sizeof(length)) == -1)
		goto rollback;
	if (mp_typeof(*length) != MP_UINT)
		goto rollback;
	size_t size = mp_decode_uint(&data);
	r->buf = tnt_mem_alloc(size);
	r->buf_size = size;
	if (r->buf == NULL)
		goto rollback;
	if(rcv(ptr, (char *)r->buf, size) == -1)
		goto rollback;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, r->buf, r->buf_size, &hdr_length) != 0)
		goto rollback;
	if (size == (size_t)hdr_length)
		return 0; /* no body */
	if (tnt_reply_body0(r, r->buf + hdr_length, r->buf_size - hdr_length, NULL) != 0)
		goto rollback;

	return 0;
rollback:
	if (r->buf) tnt_mem_free((void *)r->buf);
	alloc = r->alloc;
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return -1;
}